

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy_visualize.hpp
# Opt level: O0

void visualize(SphereTree *tree)

{
  vec3f camerapos;
  initializer_list<SphereTree> __l;
  bool bVar1;
  reference pSVar2;
  SphereTree *local_200;
  vector<SphereTree,_std::allocator<SphereTree>_> local_1f0;
  vec3f local_1d8;
  vec3f local_1c4;
  __cxx11 local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  __cxx11 local_178 [39];
  allocator local_151;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  vector<Sphere,_std::allocator<Sphere>_> local_f0;
  undefined1 local_d8 [8];
  SphereTree t;
  iterator __end2;
  iterator __begin2;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range2;
  vector<Sphere,_std::allocator<Sphere>_> spheres;
  allocator<SphereTree> local_75;
  int id;
  SphereTree *local_68;
  SphereTree local_60;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<SphereTree,_std::allocator<SphereTree>_> layer;
  SphereTree *tree_local;
  
  local_68 = &local_60;
  layer.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = tree;
  SphereTree::SphereTree(local_68,tree);
  local_38 = &local_60;
  local_30 = 1;
  std::allocator<SphereTree>::allocator(&local_75);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
            ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28,__l,&local_75);
  std::allocator<SphereTree>::~allocator(&local_75);
  local_200 = (SphereTree *)&local_38;
  do {
    local_200 = local_200 + -1;
    SphereTree::~SphereTree(local_200);
  } while (local_200 != &local_60);
  spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    bVar1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::empty
                      ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)&__range2);
    __end2 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                       ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28);
    t.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                            ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                  *)&t.child.
                                     super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pSVar2 = __gnu_cxx::
               __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
               ::operator*(&__end2);
      SphereTree::SphereTree((SphereTree *)local_d8,pSVar2);
      std::vector<Sphere,_std::allocator<Sphere>_>::push_back
                ((vector<Sphere,_std::allocator<Sphere>_> *)&__range2,(value_type *)local_d8);
      SphereTree::~SphereTree((SphereTree *)local_d8);
      __gnu_cxx::
      __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
      operator++(&__end2);
    }
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              (&local_f0,(vector<Sphere,_std::allocator<Sphere>_> *)&__range2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"hierarchy/",&local_151);
    std::__cxx11::to_string
              (local_178,
               spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    std::operator+(local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    std::operator+(local_110,(char *)local_130);
    std::__cxx11::to_string
              (local_1b8,
               spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    std::operator+(local_198,(char *)local_1b8);
    vec3f::vec3f(&local_1c4,3.0,2.0,-5.76543);
    local_1d8.z = local_1c4.z;
    local_1d8.x = local_1c4.x;
    local_1d8.y = local_1c4.y;
    camerapos.z = local_1c4.z;
    camerapos.x = local_1c4.x;
    camerapos.y = local_1c4.y;
    visualize(&local_f0,local_110,local_198,camerapos);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector(&local_f0);
    nextlayer(&local_1f0,(vector<SphereTree,_std::allocator<SphereTree>_> *)local_28);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::operator=
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28,&local_1f0);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_1f0);
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)&__range2);
    spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ + 1;
  }
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
            ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_28);
  return;
}

Assistant:

void visualize(SphereTree tree)
{
	std::vector<SphereTree> layer = {tree};
	for (int id=0; !layer.empty(); ++id) {
		std::vector<Sphere> spheres;
		for (auto t: layer)
			spheres.push_back(t.bound);
		visualize(spheres, std::string("hierarchy/") + std::to_string(id) + ".json", std::to_string(id) + ".png");
		layer = nextlayer(layer);
	}
}